

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::FooRequest::FooRequest(FooRequest *this,Arena *arena,FooRequest *from)

{
  ulong uVar1;
  
  (this->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)arena;
  (this->super_ZeroFieldsBase)._impl_._cached_size_.atom_ = 0;
  (this->super_ZeroFieldsBase).super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ZeroFieldsBase_0195ff50;
  uVar1 = (from->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_ZeroFieldsBase).super_Message.super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

~Uint64MessageDefaultTypeInternal() {}